

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.c++
# Opt level: O1

void __thiscall
capnp::JsonCodec::decodeField
          (JsonCodec *this,Field fieldSchema,Reader fieldValue,Orphanage orphanage,Builder output)

{
  Field field;
  Field field_00;
  Type type;
  Orphan<capnp::DynamicValue> local_100;
  BuilderArena *local_c8;
  CapTableBuilder *pCStack_c0;
  Schema local_b8;
  uint uStack_b0;
  undefined4 uStack_ac;
  SegmentReader *local_a8;
  CapTableReader *pCStack_a0;
  void *local_98;
  WirePointer *pWStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  Schema local_78;
  uint uStack_70;
  undefined4 uStack_6c;
  SegmentReader *local_68;
  CapTableReader *pCStack_60;
  void *local_58;
  WirePointer *pWStack_50;
  StructDataBitCount local_48;
  StructPointerCount SStack_44;
  undefined2 uStack_42;
  int iStack_40;
  undefined4 uStack_3c;
  
  type = StructSchema::Field::getType(&fieldSchema);
  kj::
  Table<kj::HashMap<capnp::StructSchema::Field,capnp::JsonCodec::HandlerBase*>::Entry,kj::HashIndex<kj::HashMap<capnp::StructSchema::Field,capnp::JsonCodec::HandlerBase*>::Callbacks>>
  ::find<0ul,capnp::StructSchema::Field&>
            ((Table<kj::HashMap<capnp::StructSchema::Field,capnp::JsonCodec::HandlerBase*>::Entry,kj::HashIndex<kj::HashMap<capnp::StructSchema::Field,capnp::JsonCodec::HandlerBase*>::Callbacks>>
              *)&local_100,(Field *)&((this->impl).ptr)->fieldHandlers);
  if (local_100._0_8_ == 0) {
    if ((fieldValue._reader.dataSize < 0x10) || (*fieldValue._reader.data == 0)) {
      if (((undefined1  [16])type & (undefined1  [16])0xff0000) != (undefined1  [16])0x0) {
        return;
      }
      if ((type.baseType < INTERFACE) && ((0x13000U >> (type._0_4_ & 0x1f) & 1) != 0)) {
        return;
      }
    }
    local_88 = CONCAT44(fieldSchema.proto._reader._36_4_,fieldSchema.proto._reader.dataSize);
    uStack_80 = CONCAT44(fieldSchema.proto._reader._44_4_,fieldSchema.proto._reader.nestingLimit);
    local_98 = fieldSchema.proto._reader.data;
    pWStack_90 = fieldSchema.proto._reader.pointers;
    local_a8 = fieldSchema.proto._reader.segment;
    pCStack_a0 = fieldSchema.proto._reader.capTable;
    local_b8 = fieldSchema.parent.super_Schema.raw;
    uStack_b0 = fieldSchema.index;
    uStack_ac = fieldSchema._12_4_;
    decode(&local_100,this,fieldValue,type,orphanage);
    field_00.index = (uint)_uStack_b0;
    field_00.parent.super_Schema.raw = (Schema)(Schema)local_b8.raw;
    field_00._12_4_ = SUB84(_uStack_b0,4);
    field_00.proto._reader.segment._0_4_ = (int)local_a8;
    field_00.proto._reader.segment._4_4_ = (int)((ulong)local_a8 >> 0x20);
    field_00.proto._reader.capTable._0_4_ = (int)pCStack_a0;
    field_00.proto._reader.capTable._4_4_ = (int)((ulong)pCStack_a0 >> 0x20);
    field_00.proto._reader.data._0_4_ = (int)local_98;
    field_00.proto._reader.data._4_4_ = (int)((ulong)local_98 >> 0x20);
    field_00.proto._reader.pointers._0_4_ = (int)pWStack_90;
    field_00.proto._reader.pointers._4_4_ = (int)((ulong)pWStack_90 >> 0x20);
    field_00.proto._reader.dataSize = (undefined4)local_88;
    field_00.proto._reader.pointerCount = local_88._4_2_;
    field_00.proto._reader._38_2_ = local_88._6_2_;
    field_00.proto._reader._40_8_ = uStack_80;
    DynamicStruct::Builder::adopt(&output,field_00,&local_100);
  }
  else {
    local_48 = fieldSchema.proto._reader.dataSize;
    SStack_44 = fieldSchema.proto._reader.pointerCount;
    uStack_42 = fieldSchema.proto._reader._38_2_;
    iStack_40 = fieldSchema.proto._reader.nestingLimit;
    uStack_3c = fieldSchema.proto._reader._44_4_;
    local_58 = fieldSchema.proto._reader.data;
    pWStack_50 = fieldSchema.proto._reader.pointers;
    local_68 = fieldSchema.proto._reader.segment;
    pCStack_60 = fieldSchema.proto._reader.capTable;
    local_78 = fieldSchema.parent.super_Schema.raw;
    uStack_70 = fieldSchema.index;
    uStack_6c = fieldSchema._12_4_;
    local_c8 = orphanage.arena;
    pCStack_c0 = orphanage.capTable;
    (**(code **)(**(long **)(local_100._0_8_ + 0x40) + 8))
              (&local_100,*(long **)(local_100._0_8_ + 0x40),this,type._0_8_,type.field_4.schema);
    field.proto._reader.pointerCount = SStack_44;
    field.proto._reader._38_2_ = uStack_42;
    field.proto._reader.dataSize = local_48;
    field.proto._reader._44_4_ = uStack_3c;
    field.proto._reader.nestingLimit = iStack_40;
    field.index = (uint)_uStack_70;
    field.parent.super_Schema.raw = (Schema)(Schema)local_78.raw;
    field._12_4_ = SUB84(_uStack_70,4);
    field.proto._reader.segment._0_4_ = (int)local_68;
    field.proto._reader.segment._4_4_ = (int)((ulong)local_68 >> 0x20);
    field.proto._reader.capTable._0_4_ = (int)pCStack_60;
    field.proto._reader.capTable._4_4_ = (int)((ulong)pCStack_60 >> 0x20);
    field.proto._reader.data._0_4_ = (int)local_58;
    field.proto._reader.data._4_4_ = (int)((ulong)local_58 >> 0x20);
    field.proto._reader.pointers._0_4_ = (int)pWStack_50;
    field.proto._reader.pointers._4_4_ = (int)((ulong)pWStack_50 >> 0x20);
    DynamicStruct::Builder::adopt(&output,field,&local_100);
  }
  if (local_100.builder.segment != (SegmentBuilder *)0x0) {
    capnp::_::OrphanBuilder::euthanize(&local_100.builder);
  }
  return;
}

Assistant:

void JsonCodec::decodeField(StructSchema::Field fieldSchema, JsonValue::Reader fieldValue,
                            Orphanage orphanage, DynamicStruct::Builder output) const {
  auto fieldType = fieldSchema.getType();

  KJ_IF_SOME(handler, impl->fieldHandlers.find(fieldSchema)) {
    output.adopt(fieldSchema, handler->decodeBase(*this, fieldValue, fieldType, orphanage));
  } else {
    if (!isPointerToJsonNull(fieldValue, fieldType)) {
      // If the schema type is a pointer type and the json value is null, we act as if the value
      // doesn't exist.
      output.adopt(fieldSchema, decode(fieldValue, fieldType, orphanage));
    }
  }
}